

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.cpp
# Opt level: O0

int lua_setmetatable(lua_State *L,int objindex)

{
  uint uVar1;
  TValue *pTVar2;
  GCObject *local_28;
  Table *mt;
  TValue *obj;
  int objindex_local;
  lua_State *L_local;
  
  pTVar2 = index2addr(L,objindex);
  if (L->top[-1].tt_ == 0) {
    local_28 = (GCObject *)0x0;
  }
  else {
    local_28 = L->top[-1].value_.gc;
  }
  uVar1 = pTVar2->tt_ & 0xf;
  if (uVar1 == 5) {
    *(GCObject **)((pTVar2->value_).f + 0x10) = local_28;
    if (((local_28 != (GCObject *)0x0) && (((local_28->gch).marked & 3) != 0)) &&
       (((byte)(pTVar2->value_).f[9] & 4) != 0)) {
      luaC_barrierback_(L,(pTVar2->value_).gc);
    }
    luaC_checkfinalizer(L,(pTVar2->value_).gc,&local_28->h);
  }
  else if (uVar1 == 7) {
    *(GCObject **)((pTVar2->value_).f + 0x10) = local_28;
    if (local_28 != (GCObject *)0x0) {
      if ((((local_28->gch).marked & 3) != 0) && (((byte)(pTVar2->value_).f[9] & 4) != 0)) {
        luaC_barrier_(L,(pTVar2->value_).gc,local_28);
      }
      luaC_checkfinalizer(L,(pTVar2->value_).gc,&local_28->h);
    }
  }
  else {
    L->l_G->mt[(int)(pTVar2->tt_ & 0xf)] = (Table *)local_28;
  }
  L->top = L->top + -1;
  return 1;
}

Assistant:

LUA_API int lua_setmetatable (lua_State *L, int objindex) {
  TValue *obj;
  Table *mt;
  lua_lock(L);
  api_checknelems(L, 1);
  obj = index2addr(L, objindex);
  api_checkvalidindex(L, obj);
  if (ttisnil(L->top - 1))
    mt = NULL;
  else {
    api_check(L, ttistable(L->top - 1), "table expected");
    mt = hvalue(L->top - 1);
  }
  switch (ttypenv(obj)) {
    case LUA_TTABLE: {
      hvalue(obj)->metatable = mt;
      if (mt)
        luaC_objbarrierback(L, gcvalue(obj), mt);
        luaC_checkfinalizer(L, gcvalue(obj), mt);
      break;
    }
    case LUA_TUSERDATA: {
      uvalue(obj)->metatable = mt;
      if (mt) {
        luaC_objbarrier(L, rawuvalue(obj), mt);
        luaC_checkfinalizer(L, gcvalue(obj), mt);
      }
      break;
    }
    default: {
      G(L)->mt[ttypenv(obj)] = mt;
      break;
    }
  }
  L->top--;
  lua_unlock(L);
  return 1;
}